

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AddWarning
          (DescriptorBuilder *this,string *element_name,Message *descriptor,ErrorLocation location,
          string *error)

{
  LogMessage *this_00;
  LogMessage *other;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  string *in_stack_ffffffffffffff58;
  LogMessage *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  LogMessage *in_stack_ffffffffffffff70;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff70,
               (LogLevel_conflict)((ulong)in_stack_ffffffffffffff68 >> 0x20),
               (char *)in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    internal::LogMessage::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    internal::LogMessage::operator<<(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    internal::LogMessage::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    this_00 = internal::LogMessage::operator<<
                        (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    other = internal::LogMessage::operator<<(this_00,in_stack_ffffffffffffff58);
    internal::LogFinisher::operator=((LogFinisher *)this_00,other);
    internal::LogMessage::~LogMessage((LogMessage *)0x4af9cb);
  }
  else {
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))
              (*(long **)(in_RDI + 0x10),in_RDI + 0x38,in_RSI,in_RDX,in_ECX,in_R8);
  }
  return;
}

Assistant:

void DescriptorBuilder::AddWarning(
    const std::string& element_name, const Message& descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location,
    const std::string& error) {
  if (error_collector_ == nullptr) {
    GOOGLE_LOG(WARNING) << filename_ << " " << element_name << ": " << error;
  } else {
    error_collector_->AddWarning(filename_, element_name, &descriptor, location,
                                 error);
  }
}